

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindowSettings *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindowSettings *in_RSI;
  ImChunkStream<ImGuiWindowSettings> *in_RDI;
  ImGuiWindow *window;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  
  pIVar1 = ImChunkStream<ImGuiWindowSettings>::begin
                     ((ImChunkStream<ImGuiWindowSettings> *)&in_RDI[0x2f2].Buf.Data);
  while (pIVar1 != (ImGuiWindowSettings *)0x0) {
    if ((pIVar1->WantApply & 1U) != 0) {
      pIVar2 = ImGui::FindWindowByID((ImGuiID)((ulong)pIVar1 >> 0x20));
      if (pIVar2 != (ImGuiWindow *)0x0) {
        ApplyWindowSettings((ImGuiWindow *)g,settings);
      }
      pIVar1->WantApply = false;
    }
    pIVar1 = ImChunkStream<ImGuiWindowSettings>::next_chunk(in_RDI,in_RSI);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->WantApply)
        {
            if (ImGuiWindow* window = ImGui::FindWindowByID(settings->ID))
                ApplyWindowSettings(window, settings);
            settings->WantApply = false;
        }
}